

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O0

void sensors_analytics::Sdk::Login(string *login_id)

{
  Sdk *this;
  __type _Var1;
  ulong uVar2;
  ostream *poVar3;
  allocator local_a1;
  string local_a0 [55];
  allocator local_69;
  string local_68 [32];
  undefined1 local_48 [8];
  PropertiesNode properties_node;
  string *login_id_local;
  
  if (instance_ != (Sdk *)0x0) {
    properties_node.super_ObjectNode.properties_map_._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = (size_t)login_id;
    uVar2 = std::__cxx11::string::length();
    if (uVar2 < 0x100) {
      _Var1 = std::operator==(&instance_->distinct_id_,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              properties_node.super_ObjectNode.properties_map_._M_t._M_impl.
                              super__Rb_tree_header._M_node_count);
      if (!_Var1) {
        PropertiesNode::PropertiesNode((PropertiesNode *)local_48);
        this = instance_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_68,"track_signup",&local_69);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_a0,"$SignUp",&local_a1);
        AddEvent(this,(string *)local_68,(string *)local_a0,(ObjectNode *)local_48,
                 (string *)
                 properties_node.super_ObjectNode.properties_map_._M_t._M_impl.super__Rb_tree_header
                 ._M_node_count,&instance_->distinct_id_);
        std::__cxx11::string::~string(local_a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_a1);
        std::__cxx11::string::~string(local_68);
        std::allocator<char>::~allocator((allocator<char> *)&local_69);
        std::__cxx11::string::operator=
                  ((string *)&instance_->distinct_id_,
                   (string *)
                   properties_node.super_ObjectNode.properties_map_._M_t._M_impl.
                   super__Rb_tree_header._M_node_count);
        instance_->is_login_id_ = true;
        Notify();
        PropertiesNode::~PropertiesNode((PropertiesNode *)local_48);
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"loginId:");
      poVar3 = std::operator<<(poVar3,(string *)
                                      properties_node.super_ObjectNode.properties_map_._M_t._M_impl.
                                      super__Rb_tree_header._M_node_count);
      poVar3 = std::operator<<(poVar3,"is beyond the maximum length 255");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void Sdk::Login(const string &login_id) {
  if (instance_) {

      if (login_id.length() > 255) {
          cout << "loginId:" << login_id << "is beyond the maximum length 255" << endl;
          return;
      }

      if (instance_->distinct_id_ == login_id) {
          return;
      }

    PropertiesNode properties_node;
    instance_->AddEvent("track_signup",
                        "$SignUp",
                        properties_node,
                        login_id,
                        instance_->distinct_id_);
    instance_->distinct_id_ = login_id;
    instance_->is_login_id_ = true;

      instance_->Notify();
  }
}